

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# h265d_sei.c
# Opt level: O3

RK_S32 active_parameter_sets(HEVCContext *s,BitReadCtx_t *gb)

{
  MPP_RET MVar1;
  RK_S32 RVar2;
  RK_U32 RVar3;
  RK_U32 _out_1;
  RK_U32 _out;
  RK_U32 _out_2;
  uint local_2c;
  RK_U32 local_28;
  RK_U32 local_24;
  
  MVar1 = mpp_skip_longbits(gb,4);
  gb->ret = MVar1;
  RVar2 = -0x3ec;
  if (MVar1 == MPP_OK) {
    MVar1 = mpp_skip_longbits(gb,1);
    gb->ret = MVar1;
    if (MVar1 == MPP_OK) {
      MVar1 = mpp_skip_longbits(gb,1);
      gb->ret = MVar1;
      if (MVar1 == MPP_OK) {
        MVar1 = mpp_read_ue(gb,&local_28);
        gb->ret = MVar1;
        if (MVar1 == MPP_OK) {
          MVar1 = mpp_read_ue(gb,&local_2c);
          gb->ret = MVar1;
          if (MVar1 == MPP_OK) {
            if (local_2c < 0x10) {
              s->active_seq_parameter_set_id = local_2c;
              if (0 < (int)local_28) {
                RVar3 = local_28;
                do {
                  MVar1 = mpp_read_ue(gb,&local_24);
                  gb->ret = MVar1;
                  if (MVar1 != MPP_OK) {
                    return -0x3ec;
                  }
                  RVar3 = RVar3 - 1;
                } while (RVar3 != 0);
              }
              RVar2 = 0;
            }
            else {
              _mpp_log_l(2,"h265d_sei","active_parameter_set_id %d invalid\n",(char *)0x0);
            }
          }
        }
      }
    }
  }
  return RVar2;
}

Assistant:

static RK_S32 active_parameter_sets(HEVCContext *s, BitReadCtx_t *gb)
{
    RK_S32 num_sps_ids_minus1;
    RK_S32 i, value;
    RK_U32 active_seq_parameter_set_id;

    SKIP_BITS(gb, 4); // active_video_parameter_set_id
    SKIP_BITS(gb, 1); // self_contained_cvs_flag
    SKIP_BITS(gb, 1); // num_sps_ids_minus1
    READ_UE(gb, &num_sps_ids_minus1); // num_sps_ids_minus1

    READ_UE(gb, &active_seq_parameter_set_id);
    if (active_seq_parameter_set_id >= MAX_SPS_COUNT) {
        mpp_err( "active_parameter_set_id %d invalid\n", active_seq_parameter_set_id);
        return  MPP_ERR_STREAM;
    }
    s->active_seq_parameter_set_id = active_seq_parameter_set_id;

    for (i = 1; i <= num_sps_ids_minus1; i++)
        READ_UE(gb, &value); // active_seq_parameter_set_id[i]

    return 0;
__BITREAD_ERR:
    return  MPP_ERR_STREAM;
}